

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O2

CURLcode tool_setopt(CURL *curl,_Bool str,GlobalConfig *global,OperationConfig *config,char *name,
                    CURLoption tag,...)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  CURLcode CVar4;
  size_t len;
  char *pcVar5;
  long *plVar6;
  char *pcVar7;
  bool bVar8;
  char *in_stack_00000008;
  va_list arg;
  char buf [256];
  
  if (tag < 10000) {
    pcVar7 = (char *)0x0;
    for (plVar6 = &setopt_nv_CURLNONZERODEFAULTS[0].value;
        ((NameValue *)(plVar6 + -1))->name != (char *)0x0; plVar6 = plVar6 + 2) {
      iVar3 = strcmp(name,((NameValue *)(plVar6 + -1))->name);
      if (iVar3 == 0) {
        pcVar7 = (char *)*plVar6;
        break;
      }
    }
    curl_msnprintf(buf,0x100,"%ldL",in_stack_00000008);
    CVar4 = curl_easy_setopt(curl,tag,in_stack_00000008);
    bVar8 = in_stack_00000008 == pcVar7;
LAB_0011b62c:
    bVar2 = false;
    in_stack_00000008 = buf;
    bVar1 = false;
  }
  else {
    if (29999 < tag) {
      if (39999 < tag) {
        pcVar7 = "blob pointer";
        goto LAB_0011b71d;
      }
      curl_msnprintf(buf,0x100,"(curl_off_t)%ld",in_stack_00000008);
      CVar4 = curl_easy_setopt(curl,tag,in_stack_00000008);
      bVar8 = in_stack_00000008 == (char *)0x0;
      goto LAB_0011b62c;
    }
    if (tag < 20000) {
      if (in_stack_00000008 == (char *)0x0 || !str) {
        pcVar7 = "object pointer";
        goto LAB_0011b71d;
      }
      bVar2 = true;
      bVar8 = false;
      bVar1 = false;
    }
    else {
      pcVar7 = "function pointer";
LAB_0011b71d:
      bVar1 = in_stack_00000008 != (char *)0x0;
      bVar8 = in_stack_00000008 == (char *)0x0;
      if (bVar8) {
        pcVar7 = in_stack_00000008;
      }
      in_stack_00000008 = pcVar7;
      bVar2 = false;
    }
    CVar4 = curl_easy_setopt(curl,tag);
  }
  pcVar7 = (char *)0x0;
  if (((global->libcurl != (char *)0x0) && (!bVar8)) && (CVar4 == CURLE_OK)) {
    if (bVar1) {
      pcVar5 = "";
      if (*in_stack_00000008 == 'o') {
        pcVar5 = "n";
      }
      pcVar7 = (char *)0x0;
      CVar4 = easysrc_addf(&easysrc_toohard,"%s was set to a%s %s",name,pcVar5,in_stack_00000008);
    }
    else {
      if (bVar2) {
        if (tag == CURLOPT_POSTFIELDS) {
          len = curlx_dyn_len(&config->postdata);
        }
        else {
          len = 0xffffffffffffffff;
        }
        in_stack_00000008 = c_escape(in_stack_00000008,len);
        if (in_stack_00000008 == (char *)0x0) {
          CVar4 = CURLE_OUT_OF_MEMORY;
          pcVar7 = (char *)0x0;
          goto LAB_0011b822;
        }
        pcVar5 = "curl_easy_setopt(hnd, %s, \"%s\");";
        pcVar7 = in_stack_00000008;
      }
      else {
        pcVar5 = "curl_easy_setopt(hnd, %s, %s);";
        pcVar7 = (char *)0x0;
      }
      CVar4 = easysrc_addf(&easysrc_code,pcVar5,name,in_stack_00000008);
    }
  }
LAB_0011b822:
  free(pcVar7);
  return CVar4;
}

Assistant:

CURLcode tool_setopt(CURL *curl, bool str, struct GlobalConfig *global,
                     struct OperationConfig *config,
                     const char *name, CURLoption tag, ...)
{
  va_list arg;
  char buf[256];
  const char *value = NULL;
  bool remark = FALSE;
  bool skip = FALSE;
  bool escape = FALSE;
  char *escaped = NULL;
  CURLcode ret = CURLE_OK;

  va_start(arg, tag);

  if(tag < CURLOPTTYPE_OBJECTPOINT) {
    /* Value is expected to be a long */
    long lval = va_arg(arg, long);
    long defval = 0L;
    const struct NameValue *nv = NULL;
    for(nv = setopt_nv_CURLNONZERODEFAULTS; nv->name; nv++) {
      if(!strcmp(name, nv->name)) {
        defval = nv->value;
        break; /* found it */
      }
    }

    msnprintf(buf, sizeof(buf), "%ldL", lval);
    value = buf;
    ret = curl_easy_setopt(curl, tag, lval);
    if(lval == defval)
      skip = TRUE;
  }
  else if(tag < CURLOPTTYPE_OFF_T) {
    /* Value is some sort of object pointer */
    void *pval = va_arg(arg, void *);

    /* function pointers are never printable */
    if(tag >= CURLOPTTYPE_FUNCTIONPOINT) {
      if(pval) {
        value = "function pointer";
        remark = TRUE;
      }
      else
        skip = TRUE;
    }

    else if(pval && str) {
      value = (char *)pval;
      escape = TRUE;
    }
    else if(pval) {
      value = "object pointer";
      remark = TRUE;
    }
    else
      skip = TRUE;

    ret = curl_easy_setopt(curl, tag, pval);

  }
  else if(tag < CURLOPTTYPE_BLOB) {
    /* Value is expected to be curl_off_t */
    curl_off_t oval = va_arg(arg, curl_off_t);
    msnprintf(buf, sizeof(buf),
              "(curl_off_t)%" CURL_FORMAT_CURL_OFF_T, oval);
    value = buf;
    ret = curl_easy_setopt(curl, tag, oval);

    if(!oval)
      skip = TRUE;
  }
  else {
    /* Value is a blob */
    void *pblob = va_arg(arg, void *);

    /* blobs are never printable */
    if(pblob) {
      value = "blob pointer";
      remark = TRUE;
    }
    else
      skip = TRUE;

    ret = curl_easy_setopt(curl, tag, pblob);
  }

  va_end(arg);

  if(global->libcurl && !skip && !ret) {
    /* we only use this for real if --libcurl was used */

    if(remark)
      REM3("%s was set to a%s %s", name, (*value == 'o' ? "n" : ""), value);
    else {
      if(escape) {
        curl_off_t len = ZERO_TERMINATED;
        if(tag == CURLOPT_POSTFIELDS)
          len = curlx_dyn_len(&config->postdata);
        escaped = c_escape(value, len);
        NULL_CHECK(escaped);
        CODE2("curl_easy_setopt(hnd, %s, \"%s\");", name, escaped);
      }
      else
        CODE2("curl_easy_setopt(hnd, %s, %s);", name, value);
    }
  }

nomem:
  Curl_safefree(escaped);
  return ret;
}